

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_test_util.h
# Opt level: O2

void google::protobuf::MapTestUtil::ExpectMapFieldsSet<proto2_unittest::TestMapLite>
               (TestMapLite *message)

{
  MapFieldLite<long,_long> *pMVar1;
  MapFieldLite<unsigned_int,_unsigned_int> *pMVar2;
  MapFieldLite<unsigned_long,_unsigned_long> *pMVar3;
  MapFieldLite<int,_int> *pMVar4;
  MapFieldLite<int,_float> *this;
  MapFieldLite<int,_double> *this_00;
  MapFieldLite<bool,_bool> *this_01;
  MapFieldLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_02;
  MapFieldLite<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_03;
  MapFieldLite<int,_proto2_unittest::MapEnumLite> *this_04;
  int *piVar5;
  long *plVar6;
  uint *puVar7;
  unsigned_long *puVar8;
  float *pfVar9;
  double *pdVar10;
  bool *pbVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  MapEnumLite *pMVar13;
  ForeignMessageLite *pFVar14;
  MapFieldLite<int,_proto2_unittest::ForeignMessageLite> *this_05;
  key_arg<int> kVar15;
  char *pcVar16;
  AssertionResult gtest_ar_30;
  AssertionResult gtest_ar_31;
  AssertionResult gtest_ar;
  key_arg<int> local_a4;
  MapFieldLite<int,_proto2_unittest::MapEnumLite> *local_a0;
  MapFieldLite<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_98;
  MapFieldLite<bool,_bool> *local_90;
  MapFieldLite<int,_float> *local_88;
  MapFieldLite<long,_long> *local_80;
  MapFieldLite<int,_int> *local_78;
  MapFieldLite<unsigned_long,_unsigned_long> *local_70;
  MapFieldLite<unsigned_int,_unsigned_int> *local_68;
  MapFieldLite<long,_long> *local_60;
  MapFieldLite<int,_int> *local_58;
  MapFieldLite<unsigned_long,_unsigned_long> *local_50;
  MapFieldLite<unsigned_int,_unsigned_int> *local_48;
  MapFieldLite<long,_long> *local_40;
  anon_union_584_1_493b367e_for_TestMapLite_3 *local_38;
  
  gtest_ar_30.success_ = true;
  gtest_ar_30._1_3_ = 0;
  gtest_ar_31._0_8_ = ZEXT48(*(uint *)&message->field_0);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&gtest_ar,"2","message.map_int32_int32().size()",(int *)&gtest_ar_30,
             (unsigned_long *)&gtest_ar_31);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_31);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar16 = "";
    }
    else {
      pcVar16 = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_30,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
               ,0x107,pcVar16);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_30,(Message *)&gtest_ar_31)
    ;
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    gtest_ar_30.success_ = true;
    gtest_ar_30._1_3_ = 0;
    gtest_ar_31._0_8_ = ZEXT48(*(uint *)((long)&message->field_0 + 0x20));
    testing::internal::CmpHelperEQ<int,unsigned_long>
              ((internal *)&gtest_ar,"2","message.map_int64_int64().size()",(int *)&gtest_ar_30,
               (unsigned_long *)&gtest_ar_31);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_31);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar16 = "";
      }
      else {
        pcVar16 = *(char **)gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_30,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                 ,0x108,pcVar16);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_30,(Message *)&gtest_ar_31);
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      gtest_ar_30.success_ = true;
      gtest_ar_30._1_3_ = 0;
      gtest_ar_31._0_8_ = ZEXT48(*(uint *)((long)&message->field_0 + 0x40));
      testing::internal::CmpHelperEQ<int,unsigned_long>
                ((internal *)&gtest_ar,"2","message.map_uint32_uint32().size()",(int *)&gtest_ar_30,
                 (unsigned_long *)&gtest_ar_31);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_31);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar16 = "";
        }
        else {
          pcVar16 = *(char **)gtest_ar.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_30,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                   ,0x109,pcVar16);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_30,(Message *)&gtest_ar_31);
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        gtest_ar_30.success_ = true;
        gtest_ar_30._1_3_ = 0;
        gtest_ar_31._0_8_ = ZEXT48(*(uint *)((long)&message->field_0 + 0x60));
        testing::internal::CmpHelperEQ<int,unsigned_long>
                  ((internal *)&gtest_ar,"2","message.map_uint64_uint64().size()",
                   (int *)&gtest_ar_30,(unsigned_long *)&gtest_ar_31);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_31);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar16 = "";
          }
          else {
            pcVar16 = *(char **)gtest_ar.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_30,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                     ,0x10a,pcVar16);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_30,(Message *)&gtest_ar_31);
        }
        else {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar.message_);
          gtest_ar_30.success_ = true;
          gtest_ar_30._1_3_ = 0;
          gtest_ar_31._0_8_ = ZEXT48(*(uint *)((long)&message->field_0 + 0x80));
          testing::internal::CmpHelperEQ<int,unsigned_long>
                    ((internal *)&gtest_ar,"2","message.map_sint32_sint32().size()",
                     (int *)&gtest_ar_30,(unsigned_long *)&gtest_ar_31);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar_31);
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl ==
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar16 = "";
            }
            else {
              pcVar16 = *(char **)gtest_ar.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_30,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                       ,0x10b,pcVar16);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_30,(Message *)&gtest_ar_31);
          }
          else {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar.message_);
            gtest_ar_30.success_ = true;
            gtest_ar_30._1_3_ = 0;
            gtest_ar_31._0_8_ = ZEXT48(*(uint *)((long)&message->field_0 + 0xa0));
            testing::internal::CmpHelperEQ<int,unsigned_long>
                      ((internal *)&gtest_ar,"2","message.map_sint64_sint64().size()",
                       (int *)&gtest_ar_30,(unsigned_long *)&gtest_ar_31);
            if (gtest_ar.success_ == false) {
              testing::Message::Message((Message *)&gtest_ar_31);
              if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl ==
                  (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )0x0) {
                pcVar16 = "";
              }
              else {
                pcVar16 = *(char **)gtest_ar.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_30,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                         ,0x10c,pcVar16);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_30,(Message *)&gtest_ar_31);
            }
            else {
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar.message_);
              gtest_ar_30.success_ = true;
              gtest_ar_30._1_3_ = 0;
              gtest_ar_31._0_8_ = ZEXT48(*(uint *)((long)&message->field_0 + 0xc0));
              testing::internal::CmpHelperEQ<int,unsigned_long>
                        ((internal *)&gtest_ar,"2","message.map_fixed32_fixed32().size()",
                         (int *)&gtest_ar_30,(unsigned_long *)&gtest_ar_31);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&gtest_ar_31);
                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )gtest_ar.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl ==
                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )0x0) {
                  pcVar16 = "";
                }
                else {
                  pcVar16 = *(char **)gtest_ar.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_30,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                           ,0x10d,pcVar16);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_30,(Message *)&gtest_ar_31);
              }
              else {
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar.message_);
                gtest_ar_30.success_ = true;
                gtest_ar_30._1_3_ = 0;
                gtest_ar_31._0_8_ = ZEXT48(*(uint *)((long)&message->field_0 + 0xe0));
                testing::internal::CmpHelperEQ<int,unsigned_long>
                          ((internal *)&gtest_ar,"2","message.map_fixed64_fixed64().size()",
                           (int *)&gtest_ar_30,(unsigned_long *)&gtest_ar_31);
                if (gtest_ar.success_ == false) {
                  testing::Message::Message((Message *)&gtest_ar_31);
                  if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )gtest_ar.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl ==
                      (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )0x0) {
                    pcVar16 = "";
                  }
                  else {
                    pcVar16 = *(char **)gtest_ar.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_30,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                             ,0x10e,pcVar16);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_30,(Message *)&gtest_ar_31);
                }
                else {
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar.message_);
                  gtest_ar_30.success_ = true;
                  gtest_ar_30._1_3_ = 0;
                  gtest_ar_31._0_8_ = ZEXT48(*(uint *)((long)&message->field_0 + 0x100));
                  testing::internal::CmpHelperEQ<int,unsigned_long>
                            ((internal *)&gtest_ar,"2","message.map_sfixed32_sfixed32().size()",
                             (int *)&gtest_ar_30,(unsigned_long *)&gtest_ar_31);
                  if (gtest_ar.success_ == false) {
                    testing::Message::Message((Message *)&gtest_ar_31);
                    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl ==
                        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )0x0) {
                      pcVar16 = "";
                    }
                    else {
                      pcVar16 = *(char **)gtest_ar.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_30,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                               ,0x10f,pcVar16);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_30,(Message *)&gtest_ar_31);
                  }
                  else {
                    std::
                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~unique_ptr(&gtest_ar.message_);
                    gtest_ar_30.success_ = true;
                    gtest_ar_30._1_3_ = 0;
                    gtest_ar_31._0_8_ = ZEXT48(*(uint *)((long)&message->field_0 + 0x120));
                    testing::internal::CmpHelperEQ<int,unsigned_long>
                              ((internal *)&gtest_ar,"2","message.map_sfixed64_sfixed64().size()",
                               (int *)&gtest_ar_30,(unsigned_long *)&gtest_ar_31);
                    if (gtest_ar.success_ == false) {
                      testing::Message::Message((Message *)&gtest_ar_31);
                      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl ==
                          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )0x0) {
                        pcVar16 = "";
                      }
                      else {
                        pcVar16 = *(char **)gtest_ar.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&gtest_ar_30,kFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                 ,0x110,pcVar16);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&gtest_ar_30,(Message *)&gtest_ar_31);
                    }
                    else {
                      std::
                      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~unique_ptr(&gtest_ar.message_);
                      gtest_ar_30.success_ = true;
                      gtest_ar_30._1_3_ = 0;
                      gtest_ar_31._0_8_ = ZEXT48(*(uint *)((long)&message->field_0 + 0x140));
                      testing::internal::CmpHelperEQ<int,unsigned_long>
                                ((internal *)&gtest_ar,"2","message.map_int32_float().size()",
                                 (int *)&gtest_ar_30,(unsigned_long *)&gtest_ar_31);
                      if (gtest_ar.success_ == false) {
                        testing::Message::Message((Message *)&gtest_ar_31);
                        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )gtest_ar.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl ==
                            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )0x0) {
                          pcVar16 = "";
                        }
                        else {
                          pcVar16 = *(char **)gtest_ar.message_._M_t.
                                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                              ._M_head_impl;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&gtest_ar_30,kFatalFailure,
                                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                   ,0x111,pcVar16);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&gtest_ar_30,(Message *)&gtest_ar_31);
                      }
                      else {
                        std::
                        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::~unique_ptr(&gtest_ar.message_);
                        gtest_ar_30.success_ = true;
                        gtest_ar_30._1_3_ = 0;
                        gtest_ar_31._0_8_ = ZEXT48(*(uint *)((long)&message->field_0 + 0x160));
                        testing::internal::CmpHelperEQ<int,unsigned_long>
                                  ((internal *)&gtest_ar,"2","message.map_int32_double().size()",
                                   (int *)&gtest_ar_30,(unsigned_long *)&gtest_ar_31);
                        if (gtest_ar.success_ == false) {
                          testing::Message::Message((Message *)&gtest_ar_31);
                          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )gtest_ar.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl ==
                              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )0x0) {
                            pcVar16 = "";
                          }
                          else {
                            pcVar16 = *(char **)gtest_ar.message_._M_t.
                                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                .
                                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                ._M_head_impl;
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&gtest_ar_30,kFatalFailure,
                                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                     ,0x112,pcVar16);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&gtest_ar_30,(Message *)&gtest_ar_31);
                        }
                        else {
                          std::
                          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::~unique_ptr(&gtest_ar.message_);
                          gtest_ar_30.success_ = true;
                          gtest_ar_30._1_3_ = 0;
                          gtest_ar_31._0_8_ = ZEXT48(*(uint *)((long)&message->field_0 + 0x180));
                          testing::internal::CmpHelperEQ<int,unsigned_long>
                                    ((internal *)&gtest_ar,"2","message.map_bool_bool().size()",
                                     (int *)&gtest_ar_30,(unsigned_long *)&gtest_ar_31);
                          if (gtest_ar.success_ == false) {
                            testing::Message::Message((Message *)&gtest_ar_31);
                            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )gtest_ar.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl ==
                                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )0x0) {
                              pcVar16 = "";
                            }
                            else {
                              pcVar16 = *(char **)gtest_ar.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&gtest_ar_30,kFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                       ,0x113,pcVar16);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&gtest_ar_30,(Message *)&gtest_ar_31);
                          }
                          else {
                            std::
                            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::~unique_ptr(&gtest_ar.message_);
                            gtest_ar_30.success_ = true;
                            gtest_ar_30._1_3_ = 0;
                            gtest_ar_31._0_8_ = ZEXT48(*(uint *)((long)&message->field_0 + 0x1a0));
                            testing::internal::CmpHelperEQ<int,unsigned_long>
                                      ((internal *)&gtest_ar,"2",
                                       "message.map_string_string().size()",(int *)&gtest_ar_30,
                                       (unsigned_long *)&gtest_ar_31);
                            if (gtest_ar.success_ == false) {
                              testing::Message::Message((Message *)&gtest_ar_31);
                              if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )gtest_ar.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl ==
                                  (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )0x0) {
                                pcVar16 = "";
                              }
                              else {
                                pcVar16 = *(char **)gtest_ar.message_._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)&gtest_ar_30,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                         ,0x114,pcVar16);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)&gtest_ar_30,(Message *)&gtest_ar_31);
                            }
                            else {
                              std::
                              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::~unique_ptr(&gtest_ar.message_);
                              gtest_ar_30.success_ = true;
                              gtest_ar_30._1_3_ = 0;
                              gtest_ar_31._0_8_ = ZEXT48(*(uint *)((long)&message->field_0 + 0x1c0))
                              ;
                              testing::internal::CmpHelperEQ<int,unsigned_long>
                                        ((internal *)&gtest_ar,"2",
                                         "message.map_int32_bytes().size()",(int *)&gtest_ar_30,
                                         (unsigned_long *)&gtest_ar_31);
                              if (gtest_ar.success_ == false) {
                                testing::Message::Message((Message *)&gtest_ar_31);
                                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )gtest_ar.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl ==
                                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )0x0) {
                                  pcVar16 = "";
                                }
                                else {
                                  pcVar16 = *(char **)gtest_ar.message_._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_30,kFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                           ,0x115,pcVar16);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_30,(Message *)&gtest_ar_31);
                              }
                              else {
                                std::
                                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::~unique_ptr(&gtest_ar.message_);
                                gtest_ar_30.success_ = true;
                                gtest_ar_30._1_3_ = 0;
                                gtest_ar_31._0_8_ =
                                     ZEXT48(*(uint *)((long)&message->field_0 + 0x1e0));
                                testing::internal::CmpHelperEQ<int,unsigned_long>
                                          ((internal *)&gtest_ar,"2",
                                           "message.map_int32_enum().size()",(int *)&gtest_ar_30,
                                           (unsigned_long *)&gtest_ar_31);
                                if (gtest_ar.success_ == false) {
                                  testing::Message::Message((Message *)&gtest_ar_31);
                                  if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )gtest_ar.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl ==
                                      (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )0x0) {
                                    pcVar16 = "";
                                  }
                                  else {
                                    pcVar16 = *(char **)gtest_ar.message_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                  }
                                  testing::internal::AssertHelper::AssertHelper
                                            ((AssertHelper *)&gtest_ar_30,kFatalFailure,
                                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                             ,0x116,pcVar16);
                                  testing::internal::AssertHelper::operator=
                                            ((AssertHelper *)&gtest_ar_30,(Message *)&gtest_ar_31);
                                }
                                else {
                                  std::
                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ::~unique_ptr(&gtest_ar.message_);
                                  gtest_ar_30.success_ = true;
                                  gtest_ar_30._1_3_ = 0;
                                  gtest_ar_31._0_8_ =
                                       ZEXT48(*(uint *)((long)&message->field_0 + 0x200));
                                  testing::internal::CmpHelperEQ<int,unsigned_long>
                                            ((internal *)&gtest_ar,"2",
                                             "message.map_int32_foreign_message().size()",
                                             (int *)&gtest_ar_30,(unsigned_long *)&gtest_ar_31);
                                  if (gtest_ar.success_ != false) {
                                    std::
                                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::~unique_ptr(&gtest_ar.message_);
                                    gtest_ar_31._0_8_ = gtest_ar_31._0_8_ & 0xffffffff00000000;
                                    gtest_ar_30.success_ = false;
                                    gtest_ar_30._1_3_ = 0;
                                    local_38 = &message->field_0;
                                    piVar5 = Map<int,_int>::at<int>
                                                       ((Map<int,_int> *)&(message->field_0)._impl_,
                                                        (key_arg<int> *)&gtest_ar_30);
                                    testing::internal::CmpHelperEQ<int,int>
                                              ((internal *)&gtest_ar,"0",
                                               "message.map_int32_int32().at(0)",(int *)&gtest_ar_31
                                               ,piVar5);
                                    if (gtest_ar.success_ == false) {
                                      testing::Message::Message((Message *)&gtest_ar_31);
                                      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )gtest_ar.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl ==
                                          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )0x0) {
                                        pcVar16 = "";
                                      }
                                      else {
                                        pcVar16 = *(char **)gtest_ar.message_._M_t.
                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_30,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x119,pcVar16);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_30,
                                                 (Message *)&gtest_ar_31);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_30);
                                      if (gtest_ar_31._0_8_ != 0) {
                                        (**(code **)(*(long *)gtest_ar_31._0_8_ + 8))();
                                      }
                                    }
                                    pMVar1 = &(message->field_0)._impl_.map_int64_int64_;
                                    std::
                                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::~unique_ptr(&gtest_ar.message_);
                                    gtest_ar_30.success_ = false;
                                    gtest_ar_30._1_3_ = 0;
                                    gtest_ar_31.success_ = false;
                                    gtest_ar_31._1_7_ = 0;
                                    local_40 = pMVar1;
                                    plVar6 = Map<long,_long>::at<long>
                                                       ((Map<long,_long> *)pMVar1,
                                                        (key_arg<long> *)&gtest_ar_31);
                                    testing::internal::CmpHelperEQ<int,long>
                                              ((internal *)&gtest_ar,"0",
                                               "message.map_int64_int64().at(0)",(int *)&gtest_ar_30
                                               ,plVar6);
                                    if (gtest_ar.success_ == false) {
                                      testing::Message::Message((Message *)&gtest_ar_31);
                                      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )gtest_ar.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl ==
                                          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )0x0) {
                                        pcVar16 = "";
                                      }
                                      else {
                                        pcVar16 = *(char **)gtest_ar.message_._M_t.
                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_30,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x11a,pcVar16);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_30,
                                                 (Message *)&gtest_ar_31);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_30);
                                      if (gtest_ar_31._0_8_ != 0) {
                                        (**(code **)(*(long *)gtest_ar_31._0_8_ + 8))();
                                      }
                                    }
                                    pMVar2 = &(message->field_0)._impl_.map_uint32_uint32_;
                                    std::
                                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::~unique_ptr(&gtest_ar.message_);
                                    gtest_ar_31._0_8_ = gtest_ar_31._0_8_ & 0xffffffff00000000;
                                    gtest_ar_30.success_ = false;
                                    gtest_ar_30._1_3_ = 0;
                                    local_48 = pMVar2;
                                    puVar7 = Map<unsigned_int,_unsigned_int>::at<unsigned_int>
                                                       ((Map<unsigned_int,_unsigned_int> *)pMVar2,
                                                        (key_arg<unsigned_int> *)&gtest_ar_30);
                                    testing::internal::CmpHelperEQ<int,unsigned_int>
                                              ((internal *)&gtest_ar,"0",
                                               "message.map_uint32_uint32().at(0)",
                                               (int *)&gtest_ar_31,puVar7);
                                    if (gtest_ar.success_ == false) {
                                      testing::Message::Message((Message *)&gtest_ar_31);
                                      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )gtest_ar.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl ==
                                          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )0x0) {
                                        pcVar16 = "";
                                      }
                                      else {
                                        pcVar16 = *(char **)gtest_ar.message_._M_t.
                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_30,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x11b,pcVar16);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_30,
                                                 (Message *)&gtest_ar_31);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_30);
                                      if (gtest_ar_31._0_8_ != 0) {
                                        (**(code **)(*(long *)gtest_ar_31._0_8_ + 8))();
                                      }
                                    }
                                    pMVar3 = &(message->field_0)._impl_.map_uint64_uint64_;
                                    std::
                                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::~unique_ptr(&gtest_ar.message_);
                                    gtest_ar_30.success_ = false;
                                    gtest_ar_30._1_3_ = 0;
                                    gtest_ar_31.success_ = false;
                                    gtest_ar_31._1_7_ = 0;
                                    local_50 = pMVar3;
                                    puVar8 = Map<unsigned_long,_unsigned_long>::at<unsigned_long>
                                                       ((Map<unsigned_long,_unsigned_long> *)pMVar3,
                                                        (key_arg<unsigned_long> *)&gtest_ar_31);
                                    testing::internal::CmpHelperEQ<int,unsigned_long>
                                              ((internal *)&gtest_ar,"0",
                                               "message.map_uint64_uint64().at(0)",
                                               (int *)&gtest_ar_30,puVar8);
                                    if (gtest_ar.success_ == false) {
                                      testing::Message::Message((Message *)&gtest_ar_31);
                                      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )gtest_ar.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl ==
                                          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )0x0) {
                                        pcVar16 = "";
                                      }
                                      else {
                                        pcVar16 = *(char **)gtest_ar.message_._M_t.
                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_30,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x11c,pcVar16);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_30,
                                                 (Message *)&gtest_ar_31);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_30);
                                      if (gtest_ar_31._0_8_ != 0) {
                                        (**(code **)(*(long *)gtest_ar_31._0_8_ + 8))();
                                      }
                                    }
                                    pMVar4 = &(message->field_0)._impl_.map_sint32_sint32_;
                                    std::
                                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::~unique_ptr(&gtest_ar.message_);
                                    gtest_ar_31._0_8_ = gtest_ar_31._0_8_ & 0xffffffff00000000;
                                    gtest_ar_30.success_ = false;
                                    gtest_ar_30._1_3_ = 0;
                                    local_58 = pMVar4;
                                    piVar5 = Map<int,_int>::at<int>
                                                       ((Map<int,_int> *)pMVar4,
                                                        (key_arg<int> *)&gtest_ar_30);
                                    testing::internal::CmpHelperEQ<int,int>
                                              ((internal *)&gtest_ar,"0",
                                               "message.map_sint32_sint32().at(0)",
                                               (int *)&gtest_ar_31,piVar5);
                                    if (gtest_ar.success_ == false) {
                                      testing::Message::Message((Message *)&gtest_ar_31);
                                      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )gtest_ar.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl ==
                                          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )0x0) {
                                        pcVar16 = "";
                                      }
                                      else {
                                        pcVar16 = *(char **)gtest_ar.message_._M_t.
                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_30,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x11d,pcVar16);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_30,
                                                 (Message *)&gtest_ar_31);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_30);
                                      if (gtest_ar_31._0_8_ != 0) {
                                        (**(code **)(*(long *)gtest_ar_31._0_8_ + 8))();
                                      }
                                    }
                                    pMVar1 = &(message->field_0)._impl_.map_sint64_sint64_;
                                    std::
                                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::~unique_ptr(&gtest_ar.message_);
                                    gtest_ar_30.success_ = false;
                                    gtest_ar_30._1_3_ = 0;
                                    gtest_ar_31.success_ = false;
                                    gtest_ar_31._1_7_ = 0;
                                    local_60 = pMVar1;
                                    plVar6 = Map<long,_long>::at<long>
                                                       ((Map<long,_long> *)pMVar1,
                                                        (key_arg<long> *)&gtest_ar_31);
                                    testing::internal::CmpHelperEQ<int,long>
                                              ((internal *)&gtest_ar,"0",
                                               "message.map_sint64_sint64().at(0)",
                                               (int *)&gtest_ar_30,plVar6);
                                    if (gtest_ar.success_ == false) {
                                      testing::Message::Message((Message *)&gtest_ar_31);
                                      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )gtest_ar.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl ==
                                          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )0x0) {
                                        pcVar16 = "";
                                      }
                                      else {
                                        pcVar16 = *(char **)gtest_ar.message_._M_t.
                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_30,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x11e,pcVar16);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_30,
                                                 (Message *)&gtest_ar_31);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_30);
                                      if (gtest_ar_31._0_8_ != 0) {
                                        (**(code **)(*(long *)gtest_ar_31._0_8_ + 8))();
                                      }
                                    }
                                    pMVar2 = &(message->field_0)._impl_.map_fixed32_fixed32_;
                                    std::
                                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::~unique_ptr(&gtest_ar.message_);
                                    gtest_ar_31._0_8_ = gtest_ar_31._0_8_ & 0xffffffff00000000;
                                    gtest_ar_30.success_ = false;
                                    gtest_ar_30._1_3_ = 0;
                                    local_68 = pMVar2;
                                    puVar7 = Map<unsigned_int,_unsigned_int>::at<unsigned_int>
                                                       ((Map<unsigned_int,_unsigned_int> *)pMVar2,
                                                        (key_arg<unsigned_int> *)&gtest_ar_30);
                                    testing::internal::CmpHelperEQ<int,unsigned_int>
                                              ((internal *)&gtest_ar,"0",
                                               "message.map_fixed32_fixed32().at(0)",
                                               (int *)&gtest_ar_31,puVar7);
                                    if (gtest_ar.success_ == false) {
                                      testing::Message::Message((Message *)&gtest_ar_31);
                                      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )gtest_ar.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl ==
                                          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )0x0) {
                                        pcVar16 = "";
                                      }
                                      else {
                                        pcVar16 = *(char **)gtest_ar.message_._M_t.
                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_30,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x11f,pcVar16);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_30,
                                                 (Message *)&gtest_ar_31);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_30);
                                      if (gtest_ar_31._0_8_ != 0) {
                                        (**(code **)(*(long *)gtest_ar_31._0_8_ + 8))();
                                      }
                                    }
                                    pMVar3 = &(message->field_0)._impl_.map_fixed64_fixed64_;
                                    std::
                                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::~unique_ptr(&gtest_ar.message_);
                                    gtest_ar_30.success_ = false;
                                    gtest_ar_30._1_3_ = 0;
                                    gtest_ar_31.success_ = false;
                                    gtest_ar_31._1_7_ = 0;
                                    local_70 = pMVar3;
                                    puVar8 = Map<unsigned_long,_unsigned_long>::at<unsigned_long>
                                                       ((Map<unsigned_long,_unsigned_long> *)pMVar3,
                                                        (key_arg<unsigned_long> *)&gtest_ar_31);
                                    testing::internal::CmpHelperEQ<int,unsigned_long>
                                              ((internal *)&gtest_ar,"0",
                                               "message.map_fixed64_fixed64().at(0)",
                                               (int *)&gtest_ar_30,puVar8);
                                    if (gtest_ar.success_ == false) {
                                      testing::Message::Message((Message *)&gtest_ar_31);
                                      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )gtest_ar.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl ==
                                          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )0x0) {
                                        pcVar16 = "";
                                      }
                                      else {
                                        pcVar16 = *(char **)gtest_ar.message_._M_t.
                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_30,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x120,pcVar16);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_30,
                                                 (Message *)&gtest_ar_31);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_30);
                                      if (gtest_ar_31._0_8_ != 0) {
                                        (**(code **)(*(long *)gtest_ar_31._0_8_ + 8))();
                                      }
                                    }
                                    pMVar4 = &(message->field_0)._impl_.map_sfixed32_sfixed32_;
                                    std::
                                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::~unique_ptr(&gtest_ar.message_);
                                    gtest_ar_31._0_8_ = gtest_ar_31._0_8_ & 0xffffffff00000000;
                                    gtest_ar_30.success_ = false;
                                    gtest_ar_30._1_3_ = 0;
                                    local_78 = pMVar4;
                                    piVar5 = Map<int,_int>::at<int>
                                                       ((Map<int,_int> *)pMVar4,
                                                        (key_arg<int> *)&gtest_ar_30);
                                    testing::internal::CmpHelperEQ<int,int>
                                              ((internal *)&gtest_ar,"0",
                                               "message.map_sfixed32_sfixed32().at(0)",
                                               (int *)&gtest_ar_31,piVar5);
                                    if (gtest_ar.success_ == false) {
                                      testing::Message::Message((Message *)&gtest_ar_31);
                                      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )gtest_ar.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl ==
                                          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )0x0) {
                                        pcVar16 = "";
                                      }
                                      else {
                                        pcVar16 = *(char **)gtest_ar.message_._M_t.
                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_30,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x121,pcVar16);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_30,
                                                 (Message *)&gtest_ar_31);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_30);
                                      if (gtest_ar_31._0_8_ != 0) {
                                        (**(code **)(*(long *)gtest_ar_31._0_8_ + 8))();
                                      }
                                    }
                                    pMVar1 = &(message->field_0)._impl_.map_sfixed64_sfixed64_;
                                    std::
                                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::~unique_ptr(&gtest_ar.message_);
                                    gtest_ar_30.success_ = false;
                                    gtest_ar_30._1_3_ = 0;
                                    gtest_ar_31.success_ = false;
                                    gtest_ar_31._1_7_ = 0;
                                    local_80 = pMVar1;
                                    plVar6 = Map<long,_long>::at<long>
                                                       ((Map<long,_long> *)pMVar1,
                                                        (key_arg<long> *)&gtest_ar_31);
                                    testing::internal::CmpHelperEQ<int,long>
                                              ((internal *)&gtest_ar,"0",
                                               "message.map_sfixed64_sfixed64().at(0)",
                                               (int *)&gtest_ar_30,plVar6);
                                    if (gtest_ar.success_ == false) {
                                      testing::Message::Message((Message *)&gtest_ar_31);
                                      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )gtest_ar.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl ==
                                          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )0x0) {
                                        pcVar16 = "";
                                      }
                                      else {
                                        pcVar16 = *(char **)gtest_ar.message_._M_t.
                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_30,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x122,pcVar16);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_30,
                                                 (Message *)&gtest_ar_31);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_30);
                                      if (gtest_ar_31._0_8_ != 0) {
                                        (**(code **)(*(long *)gtest_ar_31._0_8_ + 8))();
                                      }
                                    }
                                    this = &(message->field_0)._impl_.map_int32_float_;
                                    std::
                                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::~unique_ptr(&gtest_ar.message_);
                                    gtest_ar_31._0_8_ = gtest_ar_31._0_8_ & 0xffffffff00000000;
                                    gtest_ar_30.success_ = false;
                                    gtest_ar_30._1_3_ = 0;
                                    local_88 = this;
                                    pfVar9 = Map<int,_float>::at<int>
                                                       ((Map<int,_float> *)this,
                                                        (key_arg<int> *)&gtest_ar_30);
                                    testing::internal::CmpHelperEQ<int,float>
                                              ((internal *)&gtest_ar,"0",
                                               "message.map_int32_float().at(0)",(int *)&gtest_ar_31
                                               ,pfVar9);
                                    if (gtest_ar.success_ == false) {
                                      testing::Message::Message((Message *)&gtest_ar_31);
                                      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )gtest_ar.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl ==
                                          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )0x0) {
                                        pcVar16 = "";
                                      }
                                      else {
                                        pcVar16 = *(char **)gtest_ar.message_._M_t.
                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_30,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x123,pcVar16);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_30,
                                                 (Message *)&gtest_ar_31);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_30);
                                      if (gtest_ar_31._0_8_ != 0) {
                                        (**(code **)(*(long *)gtest_ar_31._0_8_ + 8))();
                                      }
                                    }
                                    this_00 = &(message->field_0)._impl_.map_int32_double_;
                                    std::
                                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::~unique_ptr(&gtest_ar.message_);
                                    gtest_ar_31._0_8_ = gtest_ar_31._0_8_ & 0xffffffff00000000;
                                    gtest_ar_30.success_ = false;
                                    gtest_ar_30._1_3_ = 0;
                                    pdVar10 = Map<int,_double>::at<int>
                                                        ((Map<int,_double> *)this_00,
                                                         (key_arg<int> *)&gtest_ar_30);
                                    testing::internal::CmpHelperEQ<int,double>
                                              ((internal *)&gtest_ar,"0",
                                               "message.map_int32_double().at(0)",
                                               (int *)&gtest_ar_31,pdVar10);
                                    if (gtest_ar.success_ == false) {
                                      testing::Message::Message((Message *)&gtest_ar_31);
                                      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )gtest_ar.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl ==
                                          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )0x0) {
                                        pcVar16 = "";
                                      }
                                      else {
                                        pcVar16 = *(char **)gtest_ar.message_._M_t.
                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_30,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x124,pcVar16);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_30,
                                                 (Message *)&gtest_ar_31);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_30);
                                      if (gtest_ar_31._0_8_ != 0) {
                                        (**(code **)(*(long *)gtest_ar_31._0_8_ + 8))();
                                      }
                                    }
                                    this_01 = &(message->field_0)._impl_.map_bool_bool_;
                                    std::
                                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::~unique_ptr(&gtest_ar.message_);
                                    gtest_ar_31._0_8_ = gtest_ar_31._0_8_ & 0xffffffffffffff00;
                                    gtest_ar_30._0_4_ = gtest_ar_30._0_4_ & 0xffffff00;
                                    local_90 = this_01;
                                    pbVar11 = Map<bool,_bool>::at<bool>
                                                        ((Map<bool,_bool> *)this_01,
                                                         &gtest_ar_30.success_);
                                    testing::internal::CmpHelperEQ<bool,bool>
                                              ((internal *)&gtest_ar,"false",
                                               "message.map_bool_bool().at(0)",&gtest_ar_31.success_
                                               ,pbVar11);
                                    if (gtest_ar.success_ == false) {
                                      testing::Message::Message((Message *)&gtest_ar_31);
                                      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )gtest_ar.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl ==
                                          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )0x0) {
                                        pcVar16 = "";
                                      }
                                      else {
                                        pcVar16 = *(char **)gtest_ar.message_._M_t.
                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_30,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x125,pcVar16);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_30,
                                                 (Message *)&gtest_ar_31);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_30);
                                      if (gtest_ar_31._0_8_ != 0) {
                                        (**(code **)(*(long *)gtest_ar_31._0_8_ + 8))();
                                      }
                                    }
                                    std::
                                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::~unique_ptr(&gtest_ar.message_);
                                    long_string_abi_cxx11_();
                                    long_string_abi_cxx11_();
                                    this_02 = &(message->field_0)._impl_.map_string_string_;
                                    pbVar12 = Map<std::__cxx11::string,std::__cxx11::string>::
                                              at<std::__cxx11::string>
                                                        ((
                                                  Map<std::__cxx11::string,std::__cxx11::string> *)
                                                  this_02,(
                                                  key_arg<std::__cxx11::basic_string<char>_> *)
                                                  &gtest_ar_31);
                                    testing::internal::
                                    CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                                              ((internal *)&gtest_ar_30,"long_string()",
                                               "message.map_string_string().at(long_string())",
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)&gtest_ar,pbVar12);
                                    std::__cxx11::string::~string((string *)&gtest_ar_31);
                                    std::__cxx11::string::~string((string *)&gtest_ar);
                                    if (gtest_ar_30.success_ == false) {
                                      testing::Message::Message((Message *)&gtest_ar);
                                      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )gtest_ar_30.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl ==
                                          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )0x0) {
                                        pcVar16 = "";
                                      }
                                      else {
                                        pcVar16 = *(char **)gtest_ar_30.message_._M_t.
                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_31,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x126,pcVar16);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_31,(Message *)&gtest_ar);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_31);
                                      if ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) !=
                                          (long *)0x0) {
                                        (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,
                                                                       gtest_ar.success_) + 8))();
                                      }
                                    }
                                    this_03 = &(message->field_0)._impl_.map_int32_bytes_;
                                    std::
                                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::~unique_ptr(&gtest_ar_30.message_);
                                    long_string_abi_cxx11_();
                                    gtest_ar_30.success_ = false;
                                    gtest_ar_30._1_3_ = 0;
                                    local_98 = this_03;
                                    pbVar12 = Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              ::at<int>((
                                                  Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)this_03,(key_arg<int> *)&gtest_ar_30);
                                    testing::internal::
                                    CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                                              ((internal *)&gtest_ar_31,"long_string()",
                                               "message.map_int32_bytes().at(0)",
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)&gtest_ar,pbVar12);
                                    std::__cxx11::string::~string((string *)&gtest_ar);
                                    if (gtest_ar_31.success_ == false) {
                                      testing::Message::Message((Message *)&gtest_ar);
                                      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )gtest_ar_31.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl ==
                                          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )0x0) {
                                        pcVar16 = "";
                                      }
                                      else {
                                        pcVar16 = *(char **)gtest_ar_31.message_._M_t.
                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_30,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x127,pcVar16);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_30,(Message *)&gtest_ar);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_30);
                                      if ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) !=
                                          (long *)0x0) {
                                        (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,
                                                                       gtest_ar.success_) + 8))();
                                      }
                                    }
                                    this_04 = &(message->field_0)._impl_.map_int32_enum_;
                                    std::
                                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::~unique_ptr(&gtest_ar_31.message_);
                                    gtest_ar_31._0_4_ = 1;
                                    gtest_ar_30.success_ = false;
                                    gtest_ar_30._1_3_ = 0;
                                    local_a0 = this_04;
                                    pMVar13 = Map<int,_proto2_unittest::MapEnumLite>::at<int>
                                                        ((Map<int,_proto2_unittest::MapEnumLite> *)
                                                         this_04,(key_arg<int> *)&gtest_ar_30);
                                    testing::internal::
                                    CmpHelperEQ<proto2_unittest::MapEnumLite,proto2_unittest::MapEnumLite>
                                              ((internal *)&gtest_ar,"MapEnum_BAR<TestMap>()",
                                               "message.map_int32_enum().at(0)",
                                               (MapEnumLite *)&gtest_ar_31,pMVar13);
                                    if (gtest_ar.success_ == false) {
                                      testing::Message::Message((Message *)&gtest_ar_31);
                                      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )gtest_ar.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl ==
                                          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )0x0) {
                                        pcVar16 = "";
                                      }
                                      else {
                                        pcVar16 = *(char **)gtest_ar.message_._M_t.
                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_30,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x128,pcVar16);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_30,
                                                 (Message *)&gtest_ar_31);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_30);
                                      if (gtest_ar_31._0_8_ != 0) {
                                        (**(code **)(*(long *)gtest_ar_31._0_8_ + 8))();
                                      }
                                    }
                                    this_05 = &(message->field_0)._impl_.map_int32_foreign_message_;
                                    std::
                                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::~unique_ptr(&gtest_ar.message_);
                                    gtest_ar_31._0_8_ = gtest_ar_31._0_8_ & 0xffffffff00000000;
                                    local_a4 = 0;
                                    pFVar14 = Map<int,_proto2_unittest::ForeignMessageLite>::at<int>
                                                        ((
                                                  Map<int,_proto2_unittest::ForeignMessageLite> *)
                                                  this_05,&local_a4);
                                    gtest_ar_30._0_4_ = (pFVar14->field_0)._impl_.c_;
                                    testing::internal::CmpHelperEQ<int,int>
                                              ((internal *)&gtest_ar,"0",
                                               "message.map_int32_foreign_message().at(0).c()",
                                               (int *)&gtest_ar_31,(int *)&gtest_ar_30);
                                    if (gtest_ar.success_ == false) {
                                      testing::Message::Message((Message *)&gtest_ar_31);
                                      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )gtest_ar.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl ==
                                          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )0x0) {
                                        pcVar16 = "";
                                      }
                                      else {
                                        pcVar16 = *(char **)gtest_ar.message_._M_t.
                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_30,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x129,pcVar16);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_30,
                                                 (Message *)&gtest_ar_31);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_30);
                                      if (gtest_ar_31._0_8_ != 0) {
                                        (**(code **)(*(long *)gtest_ar_31._0_8_ + 8))();
                                      }
                                    }
                                    std::
                                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::~unique_ptr(&gtest_ar.message_);
                                    kVar15 = 1;
                                    gtest_ar_31._0_4_ = 1;
                                    gtest_ar_30._0_4_ = kVar15;
                                    piVar5 = Map<int,_int>::at<int>
                                                       ((Map<int,_int> *)&local_38->_impl_,
                                                        (key_arg<int> *)&gtest_ar_30);
                                    testing::internal::CmpHelperEQ<int,int>
                                              ((internal *)&gtest_ar,"1",
                                               "message.map_int32_int32().at(1)",(int *)&gtest_ar_31
                                               ,piVar5);
                                    if (gtest_ar.success_ == false) {
                                      testing::Message::Message((Message *)&gtest_ar_31);
                                      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )gtest_ar.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl ==
                                          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )0x0) {
                                        pcVar16 = "";
                                      }
                                      else {
                                        pcVar16 = *(char **)gtest_ar.message_._M_t.
                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_30,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,299,pcVar16);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_30,
                                                 (Message *)&gtest_ar_31);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_30);
                                      if (gtest_ar_31._0_8_ != 0) {
                                        (**(code **)(*(long *)gtest_ar_31._0_8_ + 8))();
                                      }
                                    }
                                    std::
                                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::~unique_ptr(&gtest_ar.message_);
                                    gtest_ar_30.success_ = true;
                                    gtest_ar_30._1_3_ = 0;
                                    gtest_ar_31.success_ = true;
                                    gtest_ar_31._1_7_ = 0;
                                    plVar6 = Map<long,_long>::at<long>
                                                       ((Map<long,_long> *)local_40,
                                                        (key_arg<long> *)&gtest_ar_31);
                                    testing::internal::CmpHelperEQ<int,long>
                                              ((internal *)&gtest_ar,"1",
                                               "message.map_int64_int64().at(1)",(int *)&gtest_ar_30
                                               ,plVar6);
                                    if (gtest_ar.success_ == false) {
                                      testing::Message::Message((Message *)&gtest_ar_31);
                                      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )gtest_ar.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl ==
                                          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )0x0) {
                                        pcVar16 = "";
                                      }
                                      else {
                                        pcVar16 = *(char **)gtest_ar.message_._M_t.
                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_30,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,300,pcVar16);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_30,
                                                 (Message *)&gtest_ar_31);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_30);
                                      if (gtest_ar_31._0_8_ != 0) {
                                        (**(code **)(*(long *)gtest_ar_31._0_8_ + 8))();
                                      }
                                    }
                                    std::
                                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::~unique_ptr(&gtest_ar.message_);
                                    gtest_ar_31._0_4_ = 1;
                                    gtest_ar_30._0_4_ = kVar15;
                                    puVar7 = Map<unsigned_int,_unsigned_int>::at<unsigned_int>
                                                       ((Map<unsigned_int,_unsigned_int> *)local_48,
                                                        (key_arg<unsigned_int> *)&gtest_ar_30);
                                    testing::internal::CmpHelperEQ<int,unsigned_int>
                                              ((internal *)&gtest_ar,"1",
                                               "message.map_uint32_uint32().at(1)",
                                               (int *)&gtest_ar_31,puVar7);
                                    if (gtest_ar.success_ == false) {
                                      testing::Message::Message((Message *)&gtest_ar_31);
                                      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )gtest_ar.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl ==
                                          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )0x0) {
                                        pcVar16 = "";
                                      }
                                      else {
                                        pcVar16 = *(char **)gtest_ar.message_._M_t.
                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_30,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x12d,pcVar16);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_30,
                                                 (Message *)&gtest_ar_31);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_30);
                                      if (gtest_ar_31._0_8_ != 0) {
                                        (**(code **)(*(long *)gtest_ar_31._0_8_ + 8))();
                                      }
                                    }
                                    std::
                                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::~unique_ptr(&gtest_ar.message_);
                                    gtest_ar_30.success_ = true;
                                    gtest_ar_30._1_3_ = 0;
                                    gtest_ar_31.success_ = true;
                                    gtest_ar_31._1_7_ = 0;
                                    puVar8 = Map<unsigned_long,_unsigned_long>::at<unsigned_long>
                                                       ((Map<unsigned_long,_unsigned_long> *)
                                                        local_50,(key_arg<unsigned_long> *)
                                                                 &gtest_ar_31);
                                    testing::internal::CmpHelperEQ<int,unsigned_long>
                                              ((internal *)&gtest_ar,"1",
                                               "message.map_uint64_uint64().at(1)",
                                               (int *)&gtest_ar_30,puVar8);
                                    if (gtest_ar.success_ == false) {
                                      testing::Message::Message((Message *)&gtest_ar_31);
                                      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )gtest_ar.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl ==
                                          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )0x0) {
                                        pcVar16 = "";
                                      }
                                      else {
                                        pcVar16 = *(char **)gtest_ar.message_._M_t.
                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_30,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x12e,pcVar16);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_30,
                                                 (Message *)&gtest_ar_31);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_30);
                                      if (gtest_ar_31._0_8_ != 0) {
                                        (**(code **)(*(long *)gtest_ar_31._0_8_ + 8))();
                                      }
                                    }
                                    std::
                                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::~unique_ptr(&gtest_ar.message_);
                                    gtest_ar_31._0_4_ = 1;
                                    gtest_ar_30._0_4_ = kVar15;
                                    piVar5 = Map<int,_int>::at<int>
                                                       ((Map<int,_int> *)local_58,
                                                        (key_arg<int> *)&gtest_ar_30);
                                    testing::internal::CmpHelperEQ<int,int>
                                              ((internal *)&gtest_ar,"1",
                                               "message.map_sint32_sint32().at(1)",
                                               (int *)&gtest_ar_31,piVar5);
                                    if (gtest_ar.success_ == false) {
                                      testing::Message::Message((Message *)&gtest_ar_31);
                                      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )gtest_ar.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl ==
                                          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )0x0) {
                                        pcVar16 = "";
                                      }
                                      else {
                                        pcVar16 = *(char **)gtest_ar.message_._M_t.
                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_30,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x12f,pcVar16);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_30,
                                                 (Message *)&gtest_ar_31);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_30);
                                      if (gtest_ar_31._0_8_ != 0) {
                                        (**(code **)(*(long *)gtest_ar_31._0_8_ + 8))();
                                      }
                                    }
                                    std::
                                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::~unique_ptr(&gtest_ar.message_);
                                    gtest_ar_30.success_ = true;
                                    gtest_ar_30._1_3_ = 0;
                                    gtest_ar_31.success_ = true;
                                    gtest_ar_31._1_7_ = 0;
                                    plVar6 = Map<long,_long>::at<long>
                                                       ((Map<long,_long> *)local_60,
                                                        (key_arg<long> *)&gtest_ar_31);
                                    testing::internal::CmpHelperEQ<int,long>
                                              ((internal *)&gtest_ar,"1",
                                               "message.map_sint64_sint64().at(1)",
                                               (int *)&gtest_ar_30,plVar6);
                                    if (gtest_ar.success_ == false) {
                                      testing::Message::Message((Message *)&gtest_ar_31);
                                      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )gtest_ar.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl ==
                                          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )0x0) {
                                        pcVar16 = "";
                                      }
                                      else {
                                        pcVar16 = *(char **)gtest_ar.message_._M_t.
                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_30,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x130,pcVar16);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_30,
                                                 (Message *)&gtest_ar_31);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_30);
                                      if (gtest_ar_31._0_8_ != 0) {
                                        (**(code **)(*(long *)gtest_ar_31._0_8_ + 8))();
                                      }
                                    }
                                    std::
                                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::~unique_ptr(&gtest_ar.message_);
                                    gtest_ar_31._0_4_ = 1;
                                    gtest_ar_30._0_4_ = kVar15;
                                    puVar7 = Map<unsigned_int,_unsigned_int>::at<unsigned_int>
                                                       ((Map<unsigned_int,_unsigned_int> *)local_68,
                                                        (key_arg<unsigned_int> *)&gtest_ar_30);
                                    testing::internal::CmpHelperEQ<int,unsigned_int>
                                              ((internal *)&gtest_ar,"1",
                                               "message.map_fixed32_fixed32().at(1)",
                                               (int *)&gtest_ar_31,puVar7);
                                    if (gtest_ar.success_ == false) {
                                      testing::Message::Message((Message *)&gtest_ar_31);
                                      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )gtest_ar.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl ==
                                          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )0x0) {
                                        pcVar16 = "";
                                      }
                                      else {
                                        pcVar16 = *(char **)gtest_ar.message_._M_t.
                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_30,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x131,pcVar16);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_30,
                                                 (Message *)&gtest_ar_31);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_30);
                                      if (gtest_ar_31._0_8_ != 0) {
                                        (**(code **)(*(long *)gtest_ar_31._0_8_ + 8))();
                                      }
                                    }
                                    std::
                                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::~unique_ptr(&gtest_ar.message_);
                                    gtest_ar_30.success_ = true;
                                    gtest_ar_30._1_3_ = 0;
                                    gtest_ar_31.success_ = true;
                                    gtest_ar_31._1_7_ = 0;
                                    puVar8 = Map<unsigned_long,_unsigned_long>::at<unsigned_long>
                                                       ((Map<unsigned_long,_unsigned_long> *)
                                                        local_70,(key_arg<unsigned_long> *)
                                                                 &gtest_ar_31);
                                    testing::internal::CmpHelperEQ<int,unsigned_long>
                                              ((internal *)&gtest_ar,"1",
                                               "message.map_fixed64_fixed64().at(1)",
                                               (int *)&gtest_ar_30,puVar8);
                                    if (gtest_ar.success_ == false) {
                                      testing::Message::Message((Message *)&gtest_ar_31);
                                      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )gtest_ar.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl ==
                                          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )0x0) {
                                        pcVar16 = "";
                                      }
                                      else {
                                        pcVar16 = *(char **)gtest_ar.message_._M_t.
                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_30,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x132,pcVar16);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_30,
                                                 (Message *)&gtest_ar_31);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_30);
                                      if (gtest_ar_31._0_8_ != 0) {
                                        (**(code **)(*(long *)gtest_ar_31._0_8_ + 8))();
                                      }
                                    }
                                    std::
                                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::~unique_ptr(&gtest_ar.message_);
                                    gtest_ar_31._0_4_ = 1;
                                    gtest_ar_30._0_4_ = kVar15;
                                    piVar5 = Map<int,_int>::at<int>
                                                       ((Map<int,_int> *)local_78,
                                                        (key_arg<int> *)&gtest_ar_30);
                                    testing::internal::CmpHelperEQ<int,int>
                                              ((internal *)&gtest_ar,"1",
                                               "message.map_sfixed32_sfixed32().at(1)",
                                               (int *)&gtest_ar_31,piVar5);
                                    if (gtest_ar.success_ == false) {
                                      testing::Message::Message((Message *)&gtest_ar_31);
                                      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )gtest_ar.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl ==
                                          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )0x0) {
                                        pcVar16 = "";
                                      }
                                      else {
                                        pcVar16 = *(char **)gtest_ar.message_._M_t.
                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_30,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x133,pcVar16);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_30,
                                                 (Message *)&gtest_ar_31);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_30);
                                      if (gtest_ar_31._0_8_ != 0) {
                                        (**(code **)(*(long *)gtest_ar_31._0_8_ + 8))();
                                      }
                                    }
                                    std::
                                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::~unique_ptr(&gtest_ar.message_);
                                    gtest_ar_30.success_ = true;
                                    gtest_ar_30._1_3_ = 0;
                                    gtest_ar_31.success_ = true;
                                    gtest_ar_31._1_7_ = 0;
                                    plVar6 = Map<long,_long>::at<long>
                                                       ((Map<long,_long> *)local_80,
                                                        (key_arg<long> *)&gtest_ar_31);
                                    testing::internal::CmpHelperEQ<int,long>
                                              ((internal *)&gtest_ar,"1",
                                               "message.map_sfixed64_sfixed64().at(1)",
                                               (int *)&gtest_ar_30,plVar6);
                                    if (gtest_ar.success_ == false) {
                                      testing::Message::Message((Message *)&gtest_ar_31);
                                      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )gtest_ar.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl ==
                                          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )0x0) {
                                        pcVar16 = "";
                                      }
                                      else {
                                        pcVar16 = *(char **)gtest_ar.message_._M_t.
                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_30,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x134,pcVar16);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_30,
                                                 (Message *)&gtest_ar_31);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_30);
                                      if (gtest_ar_31._0_8_ != 0) {
                                        (**(code **)(*(long *)gtest_ar_31._0_8_ + 8))();
                                      }
                                    }
                                    std::
                                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::~unique_ptr(&gtest_ar.message_);
                                    gtest_ar_31._0_4_ = 1;
                                    gtest_ar_30._0_4_ = kVar15;
                                    pfVar9 = Map<int,_float>::at<int>
                                                       ((Map<int,_float> *)local_88,
                                                        (key_arg<int> *)&gtest_ar_30);
                                    testing::internal::CmpHelperEQ<int,float>
                                              ((internal *)&gtest_ar,"1",
                                               "message.map_int32_float().at(1)",(int *)&gtest_ar_31
                                               ,pfVar9);
                                    if (gtest_ar.success_ == false) {
                                      testing::Message::Message((Message *)&gtest_ar_31);
                                      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )gtest_ar.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl ==
                                          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )0x0) {
                                        pcVar16 = "";
                                      }
                                      else {
                                        pcVar16 = *(char **)gtest_ar.message_._M_t.
                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_30,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x135,pcVar16);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_30,
                                                 (Message *)&gtest_ar_31);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_30);
                                      if (gtest_ar_31._0_8_ != 0) {
                                        (**(code **)(*(long *)gtest_ar_31._0_8_ + 8))();
                                      }
                                    }
                                    std::
                                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::~unique_ptr(&gtest_ar.message_);
                                    gtest_ar_31._0_4_ = 1;
                                    gtest_ar_30._0_4_ = kVar15;
                                    pdVar10 = Map<int,_double>::at<int>
                                                        ((Map<int,_double> *)this_00,
                                                         (key_arg<int> *)&gtest_ar_30);
                                    testing::internal::CmpHelperEQ<int,double>
                                              ((internal *)&gtest_ar,"1",
                                               "message.map_int32_double().at(1)",
                                               (int *)&gtest_ar_31,pdVar10);
                                    if (gtest_ar.success_ == false) {
                                      testing::Message::Message((Message *)&gtest_ar_31);
                                      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )gtest_ar.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl ==
                                          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )0x0) {
                                        pcVar16 = "";
                                      }
                                      else {
                                        pcVar16 = *(char **)gtest_ar.message_._M_t.
                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_30,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x136,pcVar16);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_30,
                                                 (Message *)&gtest_ar_31);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_30);
                                      if (gtest_ar_31._0_8_ != 0) {
                                        (**(code **)(*(long *)gtest_ar_31._0_8_ + 8))();
                                      }
                                    }
                                    std::
                                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::~unique_ptr(&gtest_ar.message_);
                                    gtest_ar_31.success_ = true;
                                    gtest_ar_30.success_ = true;
                                    pbVar11 = Map<bool,_bool>::at<bool>
                                                        ((Map<bool,_bool> *)local_90,
                                                         &gtest_ar_30.success_);
                                    testing::internal::CmpHelperEQ<bool,bool>
                                              ((internal *)&gtest_ar,"true",
                                               "message.map_bool_bool().at(1)",&gtest_ar_31.success_
                                               ,pbVar11);
                                    if (gtest_ar.success_ == false) {
                                      testing::Message::Message((Message *)&gtest_ar_31);
                                      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )gtest_ar.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl ==
                                          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )0x0) {
                                        pcVar16 = "";
                                      }
                                      else {
                                        pcVar16 = *(char **)gtest_ar.message_._M_t.
                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_30,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x137,pcVar16);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_30,
                                                 (Message *)&gtest_ar_31);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_30);
                                      if (gtest_ar_31._0_8_ != 0) {
                                        (**(code **)(*(long *)gtest_ar_31._0_8_ + 8))();
                                      }
                                    }
                                    std::
                                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::~unique_ptr(&gtest_ar.message_);
                                    long_string_2_abi_cxx11_();
                                    long_string_2_abi_cxx11_();
                                    pbVar12 = Map<std::__cxx11::string,std::__cxx11::string>::
                                              at<std::__cxx11::string>
                                                        ((
                                                  Map<std::__cxx11::string,std::__cxx11::string> *)
                                                  this_02,(
                                                  key_arg<std::__cxx11::basic_string<char>_> *)
                                                  &gtest_ar_31);
                                    testing::internal::
                                    CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                                              ((internal *)&gtest_ar_30,"long_string_2()",
                                               "message.map_string_string().at(long_string_2())",
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)&gtest_ar,pbVar12);
                                    std::__cxx11::string::~string((string *)&gtest_ar_31);
                                    std::__cxx11::string::~string((string *)&gtest_ar);
                                    if (gtest_ar_30.success_ == false) {
                                      testing::Message::Message((Message *)&gtest_ar);
                                      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )gtest_ar_30.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl ==
                                          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )0x0) {
                                        pcVar16 = "";
                                      }
                                      else {
                                        pcVar16 = *(char **)gtest_ar_30.message_._M_t.
                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_31,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x138,pcVar16);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_31,(Message *)&gtest_ar);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_31);
                                      if ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) !=
                                          (long *)0x0) {
                                        (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,
                                                                       gtest_ar.success_) + 8))();
                                      }
                                    }
                                    std::
                                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::~unique_ptr(&gtest_ar_30.message_);
                                    long_string_2_abi_cxx11_();
                                    gtest_ar_30.success_ = true;
                                    gtest_ar_30._1_3_ = 0;
                                    pbVar12 = Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              ::at<int>((
                                                  Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)local_98,(key_arg<int> *)&gtest_ar_30);
                                    testing::internal::
                                    CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                                              ((internal *)&gtest_ar_31,"long_string_2()",
                                               "message.map_int32_bytes().at(1)",
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)&gtest_ar,pbVar12);
                                    std::__cxx11::string::~string((string *)&gtest_ar);
                                    if (gtest_ar_31.success_ == false) {
                                      testing::Message::Message((Message *)&gtest_ar);
                                      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )gtest_ar_31.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl ==
                                          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )0x0) {
                                        pcVar16 = "";
                                      }
                                      else {
                                        pcVar16 = *(char **)gtest_ar_31.message_._M_t.
                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_30,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x139,pcVar16);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_30,(Message *)&gtest_ar);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_30);
                                      if ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) !=
                                          (long *)0x0) {
                                        (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,
                                                                       gtest_ar.success_) + 8))();
                                      }
                                    }
                                    std::
                                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::~unique_ptr(&gtest_ar_31.message_);
                                    gtest_ar_31._0_4_ = 2;
                                    gtest_ar_30.success_ = true;
                                    gtest_ar_30._1_3_ = 0;
                                    pMVar13 = Map<int,_proto2_unittest::MapEnumLite>::at<int>
                                                        ((Map<int,_proto2_unittest::MapEnumLite> *)
                                                         local_a0,(key_arg<int> *)&gtest_ar_30);
                                    testing::internal::
                                    CmpHelperEQ<proto2_unittest::MapEnumLite,proto2_unittest::MapEnumLite>
                                              ((internal *)&gtest_ar,"MapEnum_BAZ<TestMap>()",
                                               "message.map_int32_enum().at(1)",
                                               (MapEnumLite *)&gtest_ar_31,pMVar13);
                                    if (gtest_ar.success_ == false) {
                                      testing::Message::Message((Message *)&gtest_ar_31);
                                      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )gtest_ar.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl ==
                                          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )0x0) {
                                        pcVar16 = "";
                                      }
                                      else {
                                        pcVar16 = *(char **)gtest_ar.message_._M_t.
                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_30,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x13a,pcVar16);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_30,
                                                 (Message *)&gtest_ar_31);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_30);
                                      if (gtest_ar_31._0_8_ != 0) {
                                        (**(code **)(*(long *)gtest_ar_31._0_8_ + 8))();
                                      }
                                    }
                                    std::
                                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::~unique_ptr(&gtest_ar.message_);
                                    gtest_ar_31._0_4_ = 1;
                                    local_a4 = kVar15;
                                    pFVar14 = Map<int,_proto2_unittest::ForeignMessageLite>::at<int>
                                                        ((
                                                  Map<int,_proto2_unittest::ForeignMessageLite> *)
                                                  this_05,&local_a4);
                                    gtest_ar_30._0_4_ = (pFVar14->field_0)._impl_.c_;
                                    testing::internal::CmpHelperEQ<int,int>
                                              ((internal *)&gtest_ar,"1",
                                               "message.map_int32_foreign_message().at(1).c()",
                                               (int *)&gtest_ar_31,(int *)&gtest_ar_30);
                                    if (gtest_ar.success_ == false) {
                                      testing::Message::Message((Message *)&gtest_ar_31);
                                      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )gtest_ar.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl ==
                                          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )0x0) {
                                        pcVar16 = "";
                                      }
                                      else {
                                        pcVar16 = *(char **)gtest_ar.message_._M_t.
                                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_30,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x13b,pcVar16);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_30,
                                                 (Message *)&gtest_ar_31);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_30);
                                      if (gtest_ar_31._0_8_ != 0) {
                                        (**(code **)(*(long *)gtest_ar_31._0_8_ + 8))();
                                      }
                                    }
                                    goto LAB_00156f08;
                                  }
                                  testing::Message::Message((Message *)&gtest_ar_31);
                                  if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )gtest_ar.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl ==
                                      (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )0x0) {
                                    pcVar16 = "";
                                  }
                                  else {
                                    pcVar16 = *(char **)gtest_ar.message_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                  }
                                  testing::internal::AssertHelper::AssertHelper
                                            ((AssertHelper *)&gtest_ar_30,kFatalFailure,
                                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                             ,0x117,pcVar16);
                                  testing::internal::AssertHelper::operator=
                                            ((AssertHelper *)&gtest_ar_30,(Message *)&gtest_ar_31);
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_30);
  if (gtest_ar_31._0_8_ != 0) {
    (**(code **)(*(long *)gtest_ar_31._0_8_ + 8))();
  }
LAB_00156f08:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  return;
}

Assistant:

void MapTestUtil::ExpectMapFieldsSet(const TestMap& message) {
  ASSERT_EQ(2, message.map_int32_int32().size());
  ASSERT_EQ(2, message.map_int64_int64().size());
  ASSERT_EQ(2, message.map_uint32_uint32().size());
  ASSERT_EQ(2, message.map_uint64_uint64().size());
  ASSERT_EQ(2, message.map_sint32_sint32().size());
  ASSERT_EQ(2, message.map_sint64_sint64().size());
  ASSERT_EQ(2, message.map_fixed32_fixed32().size());
  ASSERT_EQ(2, message.map_fixed64_fixed64().size());
  ASSERT_EQ(2, message.map_sfixed32_sfixed32().size());
  ASSERT_EQ(2, message.map_sfixed64_sfixed64().size());
  ASSERT_EQ(2, message.map_int32_float().size());
  ASSERT_EQ(2, message.map_int32_double().size());
  ASSERT_EQ(2, message.map_bool_bool().size());
  ASSERT_EQ(2, message.map_string_string().size());
  ASSERT_EQ(2, message.map_int32_bytes().size());
  ASSERT_EQ(2, message.map_int32_enum().size());
  ASSERT_EQ(2, message.map_int32_foreign_message().size());

  EXPECT_EQ(0, message.map_int32_int32().at(0));
  EXPECT_EQ(0, message.map_int64_int64().at(0));
  EXPECT_EQ(0, message.map_uint32_uint32().at(0));
  EXPECT_EQ(0, message.map_uint64_uint64().at(0));
  EXPECT_EQ(0, message.map_sint32_sint32().at(0));
  EXPECT_EQ(0, message.map_sint64_sint64().at(0));
  EXPECT_EQ(0, message.map_fixed32_fixed32().at(0));
  EXPECT_EQ(0, message.map_fixed64_fixed64().at(0));
  EXPECT_EQ(0, message.map_sfixed32_sfixed32().at(0));
  EXPECT_EQ(0, message.map_sfixed64_sfixed64().at(0));
  EXPECT_EQ(0, message.map_int32_float().at(0));
  EXPECT_EQ(0, message.map_int32_double().at(0));
  EXPECT_EQ(false, message.map_bool_bool().at(0));
  EXPECT_EQ(long_string(), message.map_string_string().at(long_string()));
  EXPECT_EQ(long_string(), message.map_int32_bytes().at(0));
  EXPECT_EQ(MapEnum_BAR<TestMap>(), message.map_int32_enum().at(0));
  EXPECT_EQ(0, message.map_int32_foreign_message().at(0).c());

  EXPECT_EQ(1, message.map_int32_int32().at(1));
  EXPECT_EQ(1, message.map_int64_int64().at(1));
  EXPECT_EQ(1, message.map_uint32_uint32().at(1));
  EXPECT_EQ(1, message.map_uint64_uint64().at(1));
  EXPECT_EQ(1, message.map_sint32_sint32().at(1));
  EXPECT_EQ(1, message.map_sint64_sint64().at(1));
  EXPECT_EQ(1, message.map_fixed32_fixed32().at(1));
  EXPECT_EQ(1, message.map_fixed64_fixed64().at(1));
  EXPECT_EQ(1, message.map_sfixed32_sfixed32().at(1));
  EXPECT_EQ(1, message.map_sfixed64_sfixed64().at(1));
  EXPECT_EQ(1, message.map_int32_float().at(1));
  EXPECT_EQ(1, message.map_int32_double().at(1));
  EXPECT_EQ(true, message.map_bool_bool().at(1));
  EXPECT_EQ(long_string_2(), message.map_string_string().at(long_string_2()));
  EXPECT_EQ(long_string_2(), message.map_int32_bytes().at(1));
  EXPECT_EQ(MapEnum_BAZ<TestMap>(), message.map_int32_enum().at(1));
  EXPECT_EQ(1, message.map_int32_foreign_message().at(1).c());
}